

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *
Catch::Detail::parseEnums
          (vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *__return_storage_ptr__,
          StringRef enums)

{
  pointer *ppSVar1;
  ulong uVar2;
  iterator __position;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  Catch *this;
  char in_R8B;
  StringRef *enumValue;
  pointer pSVar7;
  StringRef ref;
  StringRef str;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> enumValues;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> local_50;
  StringRef local_38;
  
  str.m_start = (char *)enums.m_size;
  str.m_size = 0x2c;
  splitStringRef(&local_50,(Catch *)enums.m_start,str,in_R8B);
  (__return_storage_ptr__->super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  clara::std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::reserve
            (__return_storage_ptr__,
             (long)local_50.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_50.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4);
  if (local_50.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_50.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pSVar7 = local_50.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      uVar2 = pSVar7->m_size;
      uVar5 = uVar2 + 1;
      do {
        if (uVar5 == 1) {
          uVar4 = 0;
          uVar5 = 1;
          break;
        }
        uVar4 = uVar5 - 1;
        lVar3 = uVar5 - 2;
        uVar5 = uVar4;
      } while (pSVar7->m_start[lVar3] != ':');
      this = (Catch *)(pSVar7->m_start + uVar4);
      pcVar6 = (char *)0x0;
      if (uVar4 <= uVar2) {
        pcVar6 = (char *)(uVar2 - uVar4);
      }
      if (uVar4 > uVar2 || (char *)(uVar2 - uVar4) == (char *)0x0) {
        this = (Catch *)0x168e93;
      }
      ref.m_size = uVar5;
      ref.m_start = pcVar6;
      local_38 = trim(this,ref);
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        clara::std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::
        _M_realloc_insert<Catch::StringRef>(__return_storage_ptr__,__position,&local_38);
      }
      else {
        (__position._M_current)->m_start = local_38.m_start;
        (__position._M_current)->m_size = local_38.m_size;
        ppSVar1 = &(__return_storage_ptr__->
                   super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      pSVar7 = pSVar7 + 1;
    } while (pSVar7 != local_50.
                       super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_50.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<StringRef> parseEnums( StringRef enums ) {
            auto enumValues = splitStringRef( enums, ',' );
            std::vector<StringRef> parsed;
            parsed.reserve( enumValues.size() );
            for( auto const& enumValue : enumValues ) {
                parsed.push_back(trim(extractInstanceName(enumValue)));
            }
            return parsed;
        }